

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_derived_pipeline_handle
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *state,
          Value *pipelines,ResourceTag tag,VkPipeline *out_pipeline)

{
  VkPipeline pVVar1;
  Value *this_00;
  DatabaseInterface *resolver_00;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  Ch *__nptr;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false> _Var5;
  Number NVar6;
  long lVar7;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var8;
  long *in_FS_OFFSET;
  size_t external_state_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  VkPipeline local_80;
  allocator_type local_71;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_70;
  Impl *local_68;
  Value *local_60;
  DatabaseInterface *local_58;
  size_type local_50;
  Data local_48;
  long local_38;
  
  if (tag == RESOURCE_GRAPHICS_PIPELINE) {
    lVar7 = 0x158;
  }
  else if (tag == RESOURCE_RAYTRACING_PIPELINE) {
    lVar7 = 400;
  }
  else {
    if (tag != RESOURCE_COMPUTE_PIPELINE) {
      return false;
    }
    lVar7 = 0x120;
  }
  local_60 = pipelines;
  local_58 = resolver;
  __nptr = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(state);
  local_80 = (VkPipeline)strtoull(__nptr,(char **)0x0,0x10);
  if ((local_80 == (VkPipeline)0x0) || (this->resolve_derivative_pipelines != true)) {
    *out_pipeline = local_80;
    return true;
  }
  p_Var8 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            *)((long)&(this->allocator).impl + lVar7);
  (**(code **)(*(long *)iface + 0x70))(iface);
  _Var5._M_cur = (__node_type *)
                 std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(p_Var8,(key_type *)&local_80);
  if (_Var5._M_cur != (__node_type *)0x0) {
LAB_001255bc:
    *out_pipeline =
         *(VkPipeline *)
          ((long)&((_Var5._M_cur)->
                  super__Hash_node_value<std::pair<const_unsigned_long,_VkPipeline_T_*>,_false>).
                  super__Hash_node_value_base<std::pair<const_unsigned_long,_VkPipeline_T_*>_>.
                  _M_storage._M_storage + 8);
    return true;
  }
  local_70 = p_Var8;
  local_68 = this;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetString(state);
  this_00 = local_60;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_48.s,(Ch *)local_60);
  uVar2 = local_48.n;
  NVar6.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(this_00);
  resolver_00 = local_58;
  p_Var8 = local_70;
  if (uVar2 != NVar6.i64) {
    if (tag == RESOURCE_RAYTRACING_PIPELINE) {
      bVar3 = parse_raytracing_pipeline(local_68,iface,local_58,this_00,state);
      p_Var8 = local_70;
      if (!bVar3) {
        return false;
      }
    }
    else {
      if (tag == RESOURCE_COMPUTE_PIPELINE) {
        bVar3 = parse_compute_pipeline(local_68,iface,local_58,this_00,state);
      }
      else {
        if (tag != RESOURCE_GRAPHICS_PIPELINE) {
          return false;
        }
        bVar3 = parse_graphics_pipeline(local_68,iface,local_58,this_00,state);
      }
      if (bVar3 == false) {
        return false;
      }
    }
    (**(code **)(*(long *)iface + 0x70))(iface);
    _Var5._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(p_Var8,(key_type *)&local_80);
    if (_Var5._M_cur != (__node_type *)0x0) goto LAB_001255bc;
  }
  local_50 = 0;
  if ((resolver_00 == (DatabaseInterface *)0x0) ||
     (iVar4 = (*resolver_00->_vptr_DatabaseInterface[3])(resolver_00,tag,local_80,&local_50,0,0),
     (char)iVar4 == '\0')) {
    pVVar1 = local_80;
    if (1 < *(int *)(*in_FS_OFFSET + -0x18)) {
      return false;
    }
    bVar3 = Internal::log_thread_callback
                      (LOG_DEFAULT,
                       "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                       ,"Base pipeline",local_80);
    if (bVar3) {
      return false;
    }
    fprintf(_stderr,
            "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
            ,"Base pipeline",pVVar1);
    return false;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48.s,local_50,&local_71
            );
  iVar4 = (*resolver_00->_vptr_DatabaseInterface[3])
                    (resolver_00,tag,local_80,&local_50,local_48.n.i64,0);
  if ((char)iVar4 != '\0') {
    bVar3 = parse(local_68,iface,resolver_00,(void *)local_48.n,
                  (long)local_48.s.str - local_48._0_8_);
    if (!bVar3) goto LAB_001257ff;
    (**(code **)(*(long *)iface + 0x70))(iface);
    _Var5._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipeline_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipeline_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(local_70,(key_type *)&local_80);
    if (_Var5._M_cur != (__node_type *)0x0) {
      if (*(long *)((long)_Var5._M_cur + 0x10) != 0) {
        if (local_48.n.i64 != 0) {
          operator_delete((void *)local_48.n,local_38 - local_48._0_8_);
        }
        goto LAB_001255bc;
      }
      log_invalid_resource("Base pipeline",(Hash)local_80);
      goto LAB_001257ff;
    }
  }
  log_missing_resource("Base pipeline",(Hash)local_80);
LAB_001257ff:
  if (local_48.n.i64 != 0) {
    operator_delete((void *)local_48.n,local_38 - local_48._0_8_);
  }
  return false;
}

Assistant:

bool StateReplayer::Impl::parse_derived_pipeline_handle(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                        const Value &state, const Value &pipelines,
                                                        ResourceTag tag, VkPipeline *out_pipeline)
{
	unordered_map<Hash, VkPipeline> *replayed_pipelines = nullptr;
	if (tag == RESOURCE_GRAPHICS_PIPELINE)
		replayed_pipelines = &replayed_graphics_pipelines;
	else if (tag == RESOURCE_COMPUTE_PIPELINE)
		replayed_pipelines = &replayed_compute_pipelines;
	else if (tag == RESOURCE_RAYTRACING_PIPELINE)
		replayed_pipelines = &replayed_raytracing_pipelines;
	else
		return false;

	auto pipeline = string_to_uint64(state.GetString());
	if (pipeline > 0 && resolve_derivative_pipelines)
	{
		// This is pretty bad for multithreaded replay, but this should be very rare.
		iface.sync_threads();
		auto pipeline_iter = replayed_pipelines->find(pipeline);

		// If we don't have the pipeline, we might have it later in the array of graphics pipelines, queue up out of order.
		if (pipeline_iter == replayed_pipelines->end() && pipelines.HasMember(state.GetString()))
		{
			switch (tag)
			{
			case RESOURCE_GRAPHICS_PIPELINE:
				if (!parse_graphics_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			case RESOURCE_COMPUTE_PIPELINE:
				if (!parse_compute_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			case RESOURCE_RAYTRACING_PIPELINE:
				if (!parse_raytracing_pipeline(iface, resolver, pipelines, state))
					return false;
				break;

			default:
				return false;
			}

			iface.sync_threads();
			pipeline_iter = replayed_pipelines->find(pipeline);
		}

		// Still don't have it? Look into database.
		if (pipeline_iter == replayed_pipelines->end())
		{
			size_t external_state_size = 0;
			if (!resolver || !resolver->read_entry(tag, pipeline, &external_state_size, nullptr,
			                                       PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}

			vector<uint8_t> external_state(external_state_size);

			if (!resolver->read_entry(tag, pipeline, &external_state_size, external_state.data(),
			                          PAYLOAD_READ_NO_FLAGS))
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}

			if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
				return false;

			iface.sync_threads();
			pipeline_iter = replayed_pipelines->find(pipeline);
			if (pipeline_iter == replayed_pipelines->end())
			{
				log_missing_resource("Base pipeline", pipeline);
				return false;
			}
			else if (pipeline_iter->second == VK_NULL_HANDLE)
			{
				log_invalid_resource("Base pipeline", pipeline);
				return false;
			}
		}
		*out_pipeline = pipeline_iter->second;
	}
	else
		*out_pipeline = api_object_cast<VkPipeline>(pipeline);

	return true;
}